

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O1

int __thiscall glslang::TPpContext::tZeroInput::scan(tZeroInput *this,TPpToken *ppToken)

{
  int iVar1;
  
  iVar1 = -1;
  if ((this->super_tInput).done == false) {
    ppToken->name[0] = '0';
    ppToken->name[1] = '\0';
    (ppToken->field_3).ival = 0;
    ppToken->space = false;
    (this->super_tInput).done = true;
    iVar1 = 0x98;
  }
  return iVar1;
}

Assistant:

int TPpContext::tZeroInput::scan(TPpToken* ppToken)
{
    if (done)
        return EndOfInput;

    ppToken->name[0] = '0';
    ppToken->name[1] = 0;
    ppToken->ival = 0;
    ppToken->space = false;
    done = true;

    return PpAtomConstInt;
}